

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaGetEffectiveValueConstraint
              (xmlSchemaAttributeUsePtr_conflict attruse,int *fixed,xmlChar **value,
              xmlSchemaValPtr *val)

{
  byte bVar1;
  xmlSchemaAttributePtr pxVar2;
  
  *fixed = 0;
  *value = (xmlChar *)0x0;
  pxVar2 = (xmlSchemaAttributePtr)attruse->defValue;
  if (pxVar2 == (xmlSchemaAttributePtr)0x0) {
    pxVar2 = attruse->attrDecl;
    if ((pxVar2 == (xmlSchemaAttributePtr)0x0) ||
       (pxVar2 = (xmlSchemaAttributePtr)pxVar2->defValue, pxVar2 == (xmlSchemaAttributePtr)0x0))
    goto LAB_00198c1c;
    *value = (xmlChar *)pxVar2;
    pxVar2 = attruse->attrDecl;
    bVar1 = *(byte *)((long)&pxVar2->flags + 1) & 2;
  }
  else {
    *value = (xmlChar *)pxVar2;
    bVar1 = (byte)attruse->flags & 1;
  }
  if (bVar1 != 0) {
    *fixed = 1;
    return (int)pxVar2;
  }
LAB_00198c1c:
  return (int)pxVar2;
}

Assistant:

static int
xmlSchemaGetEffectiveValueConstraint(xmlSchemaAttributeUsePtr attruse,
				     int *fixed,
				     const xmlChar **value,
				     xmlSchemaValPtr *val)
{
    *fixed = 0;
    *value = NULL;
    if (val != 0)
	*val = NULL;

    if (attruse->defValue != NULL) {
	*value = attruse->defValue;
	if (val != NULL)
	    *val = attruse->defVal;
	if (attruse->flags & XML_SCHEMA_ATTR_USE_FIXED)
	    *fixed = 1;
	return(1);
    } else if ((attruse->attrDecl != NULL) &&
	(attruse->attrDecl->defValue != NULL)) {
	*value = attruse->attrDecl->defValue;
	if (val != NULL)
	    *val = attruse->attrDecl->defVal;
	if (attruse->attrDecl->flags & XML_SCHEMAS_ATTR_FIXED)
	    *fixed = 1;
	return(1);
    }
    return(0);
}